

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  auto_ptr<cmMakefile> aVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmMakefile *pcVar5;
  ostream *poVar6;
  cmGlobalGenerator *globalGenerator;
  undefined4 extraout_var;
  char *pcVar8;
  uint uVar9;
  string *psVar10;
  pointer pbVar11;
  pointer pbVar12;
  bool bVar13;
  bool bVar14;
  int result_1;
  string dep_newest;
  auto_ptr<cmMakefile> mf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  int result;
  undefined4 uStack_a14;
  string out_oldest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  ostringstream msg_2;
  cmake cm;
  cmGlobalGenerator gg;
  long *plVar7;
  
  pcVar4 = cmsys::SystemTools::GetEnv("VERBOSE");
  if (pcVar4 == (char *)0x0) {
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      return 1;
    }
    bVar13 = false;
  }
  else {
    pcVar4 = cmsys::SystemTools::GetEnv("CMAKE_NO_VERBOSE");
    bVar13 = pcVar4 == (char *)0x0;
    if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
      if (pcVar4 != (char *)0x0) {
        return 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
      std::operator<<((ostream *)&gg,"Re-run cmake no build system arguments\n");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout
                ((char *)cm.Generators.
                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00289722;
    }
  }
  psVar10 = &this->CheckBuildSystemArgument;
  bVar2 = cmsys::SystemTools::FileExists((this->CheckBuildSystemArgument)._M_dataplus._M_p);
  if (bVar2) {
    cmake(&cm);
    std::__cxx11::string::string((string *)&gg,"",(allocator *)&msg_2);
    SetHomeDirectory(&cm,(string *)&gg);
    std::__cxx11::string::~string((string *)&gg);
    std::__cxx11::string::string((string *)&gg,"",(allocator *)&msg_2);
    SetHomeOutputDirectory(&cm,(string *)&gg);
    std::__cxx11::string::~string((string *)&gg);
    gg.MakeSilentFlag._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.Position.Position;
    gg._vptr_cmGlobalGenerator = (_func_int **)cm.CurrentSnapshot.State;
    gg._8_8_ = cm.CurrentSnapshot.Position.Tree;
    cmState::Snapshot::SetDefaultDefinitions((Snapshot *)&gg);
    cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
    pcVar5 = (cmMakefile *)operator_new(0x730);
    _msg_2 = (pointer)cm.CurrentSnapshot.State;
    cmMakefile::cmMakefile(pcVar5,&gg,(Snapshot *)&msg_2);
    mf.x_ = pcVar5;
    bVar2 = cmMakefile::ReadListFile(pcVar5,(psVar10->_M_dataplus)._M_p);
    if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), aVar1 = mf, bVar2)) {
      uVar9 = 1;
      if (bVar13 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
        poVar6 = std::operator<<((ostream *)&msg_2,"Re-run cmake error reading : ");
        poVar6 = std::operator<<(poVar6,(string *)psVar10);
        std::operator<<(poVar6,"\n");
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout(dep_newest._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dep_newest);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
      }
    }
    else {
      if (this->ClearBuildSystem == true) {
        std::__cxx11::string::string
                  ((string *)&msg_2,"CMAKE_DEPENDS_GENERATOR",(allocator *)&dep_newest);
        pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)&msg_2);
        std::__cxx11::string::~string((string *)&msg_2);
        if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
          pcVar4 = "Unix Makefiles";
        }
        std::__cxx11::string::string((string *)&msg_2,pcVar4,(allocator *)&dep_newest);
        globalGenerator = CreateGlobalGenerator(this,(string *)&msg_2);
        std::__cxx11::string::~string((string *)&msg_2);
        if (globalGenerator != (cmGlobalGenerator *)0x0) {
          _msg_2 = (pointer)cm.CurrentSnapshot.State;
          cmState::Snapshot::SetDefaultDefinitions((Snapshot *)&msg_2);
          pcVar5 = (cmMakefile *)operator_new(0x730);
          _msg_2 = (pointer)cm.CurrentSnapshot.State;
          cmMakefile::cmMakefile(pcVar5,globalGenerator,(Snapshot *)&msg_2);
          dep_newest._M_dataplus._M_p = (pointer)pcVar5;
          iVar3 = (*globalGenerator->_vptr_cmGlobalGenerator[2])(globalGenerator,pcVar5);
          plVar7 = (long *)CONCAT44(extraout_var,iVar3);
          (**(code **)(*plVar7 + 0x48))(plVar7,dep_newest._M_dataplus._M_p,bVar13);
          (**(code **)(*plVar7 + 8))(plVar7);
          cmsys::auto_ptr<cmMakefile>::~auto_ptr((auto_ptr<cmMakefile> *)&dep_newest);
          (*globalGenerator->_vptr_cmGlobalGenerator[1])(globalGenerator);
        }
      }
      aVar1.x_ = mf.x_;
      products.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      products.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      products.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string
                ((string *)&msg_2,"CMAKE_MAKEFILE_PRODUCTS",(allocator *)&dep_newest);
      pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)&msg_2);
      std::__cxx11::string::~string((string *)&msg_2);
      psVar10 = products.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::string((string *)&msg_2,pcVar4,(allocator *)&dep_newest);
        cmSystemTools::ExpandListArgument((string *)&msg_2,&products,false);
        std::__cxx11::string::~string((string *)&msg_2);
        psVar10 = products.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; aVar1.x_ = mf.x_,
          psVar10 !=
          products.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
        bVar2 = cmsys::SystemTools::FileExists((psVar10->_M_dataplus)._M_p);
        if ((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(psVar10), !bVar2)) {
          uVar9 = 1;
          if (bVar13 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
            poVar6 = std::operator<<((ostream *)&msg_2,"Re-run cmake, missing byproduct: ");
            poVar6 = std::operator<<(poVar6,(string *)psVar10);
            std::operator<<(poVar6,"\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(dep_newest._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&dep_newest);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
          }
          goto LAB_00289dcc;
        }
      }
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string
                ((string *)&msg_2,"CMAKE_MAKEFILE_DEPENDS",(allocator *)&dep_newest);
      pcVar4 = cmMakefile::GetDefinition(aVar1.x_,(string *)&msg_2);
      std::__cxx11::string::~string((string *)&msg_2);
      aVar1 = mf;
      std::__cxx11::string::string
                ((string *)&msg_2,"CMAKE_MAKEFILE_OUTPUTS",(allocator *)&dep_newest);
      pcVar8 = cmMakefile::GetDefinition(aVar1.x_,(string *)&msg_2);
      std::__cxx11::string::~string((string *)&msg_2);
      if (pcVar8 != (char *)0x0 && pcVar4 != (char *)0x0) {
        std::__cxx11::string::string((string *)&msg_2,pcVar4,(allocator *)&dep_newest);
        cmSystemTools::ExpandListArgument((string *)&msg_2,&depends,false);
        std::__cxx11::string::~string((string *)&msg_2);
        std::__cxx11::string::string((string *)&msg_2,pcVar8,(allocator *)&dep_newest);
        cmSystemTools::ExpandListArgument((string *)&msg_2,&outputs,false);
        std::__cxx11::string::~string((string *)&msg_2);
      }
      pbVar11 = depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        uVar9 = 1;
        if (bVar13 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
          std::operator<<((ostream *)&msg_2,
                          "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Stdout(dep_newest._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&dep_newest);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&dep_newest,
                   (string *)
                   depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        while (pbVar12 = outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, pbVar11 = pbVar11 + 1,
              pbVar11 !=
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          result = 0;
          bVar2 = cmFileTimeComparison::FileTimeCompare
                            (this->FileComparison,dep_newest._M_dataplus._M_p,
                             (pbVar11->_M_dataplus)._M_p,&result);
          if (!bVar2) {
            if (bVar13 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
              std::operator<<((ostream *)&msg_2,"Re-run cmake: build system dependency is missing\n"
                             );
              std::__cxx11::stringbuf::str();
              cmSystemTools::Stdout(out_oldest._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&out_oldest);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
            }
            uVar9 = 1;
            goto LAB_00289dab;
          }
          if (result < 0) {
            std::__cxx11::string::_M_assign((string *)&dep_newest);
          }
        }
        std::__cxx11::string::string
                  ((string *)&out_oldest,
                   (string *)
                   outputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        while (pbVar12 = pbVar12 + 1,
              pbVar12 !=
              outputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          result_1 = 0;
          bVar2 = cmFileTimeComparison::FileTimeCompare
                            (this->FileComparison,out_oldest._M_dataplus._M_p,
                             (pbVar12->_M_dataplus)._M_p,&result_1);
          if (!bVar2) {
            if (bVar13 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
              std::operator<<((ostream *)&msg_2,"Re-run cmake: build system output is missing\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Stdout((char *)CONCAT44(uStack_a14,result));
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
            }
            uVar9 = 1;
            goto LAB_00289da1;
          }
          if (0 < result_1) {
            std::__cxx11::string::_M_assign((string *)&out_oldest);
          }
        }
        result_1 = 0;
        bVar2 = cmFileTimeComparison::FileTimeCompare
                          (this->FileComparison,out_oldest._M_dataplus._M_p,
                           dep_newest._M_dataplus._M_p,&result_1);
        bVar14 = result_1 < 0;
        if (bVar13 == true && (!bVar2 || bVar14)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
          poVar6 = std::operator<<((ostream *)&msg_2,"Re-run cmake file: ");
          poVar6 = std::operator<<(poVar6,(string *)&out_oldest);
          poVar6 = std::operator<<(poVar6," older than: ");
          poVar6 = std::operator<<(poVar6,(string *)&dep_newest);
          std::operator<<(poVar6,"\n");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Stdout((char *)CONCAT44(uStack_a14,result));
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
        }
        uVar9 = (uint)(!bVar2 || bVar14);
LAB_00289da1:
        std::__cxx11::string::~string((string *)&out_oldest);
LAB_00289dab:
        std::__cxx11::string::~string((string *)&dep_newest);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&outputs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
LAB_00289dcc:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&products);
    }
    cmsys::auto_ptr<cmMakefile>::~auto_ptr(&mf);
    cmGlobalGenerator::~cmGlobalGenerator(&gg);
    ~cmake(&cm);
    return uVar9;
  }
  if (bVar13 == false) {
    return 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
  poVar6 = std::operator<<((ostream *)&gg,"Re-run cmake missing file: ");
  poVar6 = std::operator<<(poVar6,(string *)psVar10);
  std::operator<<(poVar6,"\n");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Stdout
            ((char *)cm.Generators.
                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
LAB_00289722:
  std::__cxx11::string::~string((string *)&cm);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
  return 1;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.  Use
  // the make system's VERBOSE environment variable to enable verbose
  // output. This can be skipped by setting CMAKE_NO_VERBOSE (which is set
  // by the Eclipse and KDevelop generators).
  bool verbose = ((cmSystemTools::GetEnv("VERBOSE") != 0)
                   && (cmSystemTools::GetEnv("CMAKE_NO_VERBOSE") == 0));

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if(this->CheckBuildSystemArgument.empty())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // If the file provided does not exist, we have to rerun.
  if(!cmSystemTools::FileExists(this->CheckBuildSystemArgument.c_str()))
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmsys::auto_ptr<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if(!mf->ReadListFile(this->CheckBuildSystemArgument.c_str()) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    // There was an error reading the file.  Just rerun.
    return 1;
    }

  if(this->ClearBuildSystem)
    {
    // Get the generator used for this build system.
    const char* genName = mf->GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if(!genName || genName[0] == '\0')
      {
      genName = "Unix Makefiles";
      }

    // Create the generator and use it to clear the dependencies.
    cmsys::auto_ptr<cmGlobalGenerator>
      ggd(this->CreateGlobalGenerator(genName));
    if(ggd.get())
      {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmsys::auto_ptr<cmMakefile> mfd(new cmMakefile(ggd.get(),
                                                    cm.GetCurrentSnapshot()));
      cmsys::auto_ptr<cmLocalGenerator> lgd(
            ggd->CreateLocalGenerator(mfd.get()));
      lgd->ClearDependencies(mfd.get(), verbose);
      }
    }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if(const char* productStr = mf->GetDefinition("CMAKE_MAKEFILE_PRODUCTS"))
    {
    cmSystemTools::ExpandListArgument(productStr, products);
    }
  for(std::vector<std::string>::const_iterator pi = products.begin();
      pi != products.end(); ++pi)
    {
    if(!(cmSystemTools::FileExists(pi->c_str()) ||
         cmSystemTools::FileIsSymlink(*pi)))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << *pi << "\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf->GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf->GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if(dependsStr && outputsStr)
    {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
    }
  if(depends.empty() || outputs.empty())
    {
    // Not enough information was provided to do the test.  Just rerun.
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
        "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for(;dep != depends.end(); ++dep)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(dep_newest.c_str(),
                                             dep->c_str(), &result))
      {
      if(result < 0)
        {
        dep_newest = *dep;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for(;out != outputs.end(); ++out)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                             out->c_str(), &result))
      {
      if(result > 0)
        {
        out_oldest = *out;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // If any output is older than any dependency then rerun.
  {
  int result = 0;
  if(!this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                            dep_newest.c_str(),
                                            &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake file: " << out_oldest
          << " older than: " << dep_newest << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }
  }

  // No need to rerun.
  return 0;
}